

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

xmlParserInputPtr pythonExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  PyObject *op;
  PyObject *op_00;
  undefined8 *puVar2;
  xmlParserInputPtr pxVar3;
  char *pcVar4;
  
  if (pythonExternalEntityLoaderObjext != (PyObject *)0x0) {
    op = libxml_xmlParserCtxtPtrWrap(ctxt);
    pxVar3 = (xmlParserInputPtr)0x0;
    op_00 = (PyObject *)
            _PyObject_CallFunction_SizeT(pythonExternalEntityLoaderObjext,"(ssO)",URL,ID,op);
    _Py_XDECREF(op);
    if (op_00 == (PyObject *)0x0) goto LAB_0013b41e;
    iVar1 = PyObject_HasAttrString(op_00,"read");
    if (iVar1 != 0) {
      puVar2 = (undefined8 *)xmlAllocParserInputBuffer(0);
      if (puVar2 != (undefined8 *)0x0) {
        *puVar2 = op_00;
        puVar2[1] = xmlPythonFileReadRaw;
        puVar2[2] = xmlPythonFileCloseRaw;
        pxVar3 = (xmlParserInputPtr)xmlNewIOInputStream(ctxt,puVar2,0);
        if (pxVar3 != (xmlParserInputPtr)0x0) {
          if (URL != (char *)0x0) {
            pcVar4 = (char *)xmlStrdup(URL);
            pxVar3->filename = pcVar4;
          }
          goto LAB_0013b41e;
        }
      }
    }
    _Py_DECREF(op_00);
  }
  pxVar3 = (xmlParserInputPtr)0x0;
LAB_0013b41e:
  if (defaultExternalEntityLoader != (xmlExternalEntityLoader)0x0 &&
      pxVar3 == (xmlParserInputPtr)0x0) {
    pxVar3 = (*defaultExternalEntityLoader)(URL,ID,ctxt);
    return pxVar3;
  }
  return pxVar3;
}

Assistant:

static xmlParserInputPtr
pythonExternalEntityLoader(const char *URL, const char *ID,
			   xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr result = NULL;
    if (pythonExternalEntityLoaderObjext != NULL) {
	PyObject *ret;
	PyObject *ctxtobj;

	ctxtobj = libxml_xmlParserCtxtPtrWrap(ctxt);

	ret = PyObject_CallFunction(pythonExternalEntityLoaderObjext,
		      (char *) "(ssO)", URL, ID, ctxtobj);
	Py_XDECREF(ctxtobj);

	if (ret != NULL) {
	    if (PyObject_HasAttrString(ret, (char *) "read")) {
		xmlParserInputBufferPtr buf;

		buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
		if (buf != NULL) {
		    buf->context = ret;
		    buf->readcallback = xmlPythonFileReadRaw;
		    buf->closecallback = xmlPythonFileCloseRaw;
		    result = xmlNewIOInputStream(ctxt, buf,
			                         XML_CHAR_ENCODING_NONE);
		}
#if 0
	    } else {
		if (URL != NULL)
		    printf("pythonExternalEntityLoader: can't read %s\n",
		           URL);
#endif
	    }
	    if (result == NULL) {
		Py_DECREF(ret);
	    } else if (URL != NULL) {
		result->filename = (char *) xmlStrdup((const xmlChar *)URL);
	    }
	}
    }
    if ((result == NULL) && (defaultExternalEntityLoader != NULL)) {
	result = defaultExternalEntityLoader(URL, ID, ctxt);
    }
    return(result);
}